

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O3

void __thiscall piksel::Graphics::line(Graphics *this,float x1,float y1,float x2,float y2)

{
  float fVar1;
  stack<piksel::State,_std::deque<piksel::State,_std::allocator<piksel::State>_>_> *psVar2;
  undefined8 uVar3;
  _Elt_pointer pSVar4;
  _Elt_pointer pSVar5;
  float __y;
  float __x;
  float fVar6;
  float fVar7;
  float __x_00;
  
  push(this);
  psVar2 = this->stateStack;
  pSVar5 = (psVar2->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar5 == (psVar2->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar5 = (psVar2->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  uVar3 = *(undefined8 *)((long)&pSVar5[-1].shaderRelevantState.strokeColor.field_0 + 8);
  *(undefined8 *)&pSVar5[-1].shaderRelevantState.fillColor.field_0 =
       *(undefined8 *)&pSVar5[-1].shaderRelevantState.strokeColor.field_0;
  *(undefined8 *)((long)&pSVar5[-1].shaderRelevantState.fillColor.field_0 + 8) = uVar3;
  pSVar5[-1].shaderIrrelevantState.fill = pSVar5[-1].shaderIrrelevantState.stroke;
  pSVar5[-1].shaderIrrelevantState.stroke = false;
  pSVar5[-1].shaderRelevantState.textureIndex = -1.0;
  __x_00 = x2 - x1;
  __y = y2 - y1;
  __x = atan2f(__y,__x_00);
  fVar6 = sinf(__x);
  fVar1 = pSVar5[-1].shaderRelevantState.strokeWeight;
  fVar7 = cosf(__x);
  translate(this,fVar6 * fVar1 * 0.5 + x1,
            y1 - fVar7 * pSVar5[-1].shaderRelevantState.strokeWeight * 0.5);
  rotate(this,__x);
  psVar2 = this->stateStack;
  pSVar4 = (psVar2->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar4 == (psVar2->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar4 = (psVar2->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  pSVar4[-1].shaderIrrelevantState.rectMode = CORNER;
  rect(this,0.0,0.0,SQRT(__y * __y + __x_00 * __x_00),pSVar5[-1].shaderRelevantState.strokeWeight);
  pop(this);
  return;
}

Assistant:

void Graphics::line(float x1, float y1, float x2, float y2) {
	push();
	State& state = peek();
	state.shaderRelevantState.fillColor = state.shaderRelevantState.strokeColor;
    state.shaderIrrelevantState.fill = state.shaderIrrelevantState.stroke;
    state.shaderIrrelevantState.stroke = false;
    state.shaderRelevantState.textureIndex = -1;
    glm::vec2 a = glm::vec2(x1, y1);
	glm::vec2 b = glm::vec2(x2, y2);
	glm::vec2 r = b - a;
	float angle = atan2f(r.y, r.x);
	translate(x1 + sinf(angle) * state.shaderRelevantState.strokeWeight / 2.0f, y1 - cosf(angle) * state.shaderRelevantState.strokeWeight / 2.0f);
	rotate(angle);
    rectMode(DrawMode::CORNER);
	rect(0.0f, 0.0f, glm::length(r), state.shaderRelevantState.strokeWeight);
    // state.shaderRelevantState.textureIndex = 0;
    // ellipseMode(DrawMode::CENTER);
    // ellipse(0.0f, state.shaderRelevantState.strokeWeight / 2.0f, state.shaderRelevantState.strokeWeight, state.shaderRelevantState.strokeWeight);
    // ellipse(glm::length(r), state.shaderRelevantState.strokeWeight / 2.0f, state.shaderRelevantState.strokeWeight, state.shaderRelevantState.strokeWeight);
	pop();
}